

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O1

bool __thiscall Analyzer::isVarCanBeString(Analyzer *this,Node *node)

{
  NodeType NVar1;
  Node *pNVar2;
  char *__s1;
  undefined8 *puVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  Node *a;
  long lVar7;
  undefined8 *puVar8;
  long lVar9;
  bool bVar10;
  
  puVar3 = DAT_0013d558;
  puVar8 = settings::function_can_return_string_abi_cxx11_;
  while( true ) {
    a = node;
    if (a == (Node *)0x0) {
      return false;
    }
    NVar1 = a->nodeType;
    if (NVar1 != PNT_BINARY_OP) break;
    if ((a->tok->type != TK_NULLCOALESCE) ||
       (node = *(a->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start, node->nodeType != PNT_STRING)) goto LAB_00126f8e;
  }
  if (NVar1 == PNT_STRING) {
    return true;
  }
LAB_00126f8e:
  if (NVar1 == PNT_FUNCTION_CALL) {
    pNVar2 = *(a->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((pNVar2->nodeType == PNT_ACCESS_MEMBER) &&
       (lVar9 = *(long *)(*(long *)&(pNVar2->children).
                                    super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                    super__Vector_impl_data + 8), *(int *)(lVar9 + 0x10) == 6)) {
      bVar10 = settings::function_can_return_string_abi_cxx11_ != DAT_0013d558;
      if (bVar10) {
        __s1 = *(char **)(*(long *)(lVar9 + 8) + 0x10);
        iVar4 = strcmp(__s1,(char *)*settings::function_can_return_string_abi_cxx11_);
        while (iVar4 != 0) {
          puVar8 = puVar8 + 4;
          bVar10 = puVar8 != puVar3;
          if (puVar8 == puVar3) break;
          iVar4 = strcmp(__s1,(char *)*puVar8);
        }
      }
      if (bVar10) {
        return true;
      }
    }
    pNVar2 = *(a->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((pNVar2->nodeType == PNT_IDENTIFIER) &&
       (iVar4 = strcmp((pNVar2->tok->u).s,"loc"), iVar4 == 0)) {
      return true;
    }
  }
  uVar5 = (int)((long)nearest_assignments.
                      super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)nearest_assignments.
                      super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
  if (0 < (int)uVar5) {
    uVar6 = (ulong)(uVar5 & 0x7fffffff);
    lVar9 = uVar6 + 1;
    lVar7 = uVar6 * 0x18;
    do {
      pNVar2 = *(Node **)((long)&nearest_assignments.
                                 super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].first + lVar7);
      if ((pNVar2 != (Node *)0x0) && (bVar10 = isNodeEquals(this,a,pNVar2), bVar10)) {
        return *(int *)(*(long *)((long)nearest_assignments.
                                        super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar7 + -0x10) +
                       0x10) == 5;
      }
      lVar9 = lVar9 + -1;
      lVar7 = lVar7 + -0x18;
    } while (1 < lVar9);
  }
  return false;
}

Assistant:

bool isVarCanBeString(Node * node)
  {
    if (!node)
      return false;

    if (node->nodeType == PNT_STRING)
      return true;

    if (node->nodeType == PNT_BINARY_OP && node->tok.type == TK_NULLCOALESCE &&
      node->children[0]->nodeType == PNT_STRING)
    {
      return isVarCanBeString(node->children[0]);
    }

    if (node->nodeType == PNT_FUNCTION_CALL && node->children[0]->nodeType == PNT_ACCESS_MEMBER &&
      node->children[0]->children[1]->nodeType == PNT_IDENTIFIER)
    {
      const char * fnName = node->children[0]->children[1]->tok.u.s;
      if (settings::find(fnName, settings::function_can_return_string))
        return true;
    }

    if (node->nodeType == PNT_FUNCTION_CALL && node->children[0]->nodeType == PNT_IDENTIFIER)
    {
      const char * fnName = node->children[0]->tok.u.s;
      if (
        !strcmp(fnName, "loc")
        )
      {
        return true;
      }
    }



    for (int i = int(nearest_assignments.size()) - 1; i >= 0; i--)
      if (nearest_assignments[i].first && isNodeEquals(node, nearest_assignments[i].first))
      {
        if (nearest_assignments[i].second.first->nodeType == PNT_STRING)
          return true;
        break;
      }

    return false;
  }